

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

int uv__async_eventfd(void)

{
  int iVar1;
  int *piVar2;
  int fd;
  
  if (uv__async_eventfd::no_eventfd2 == 0) {
    iVar1 = uv__eventfd2(0,0x80800);
    if (iVar1 != -1) {
      return iVar1;
    }
    piVar2 = __errno_location();
    if (*piVar2 != 0x26) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
    uv__async_eventfd::no_eventfd2 = 1;
  }
  if (uv__async_eventfd::no_eventfd == 0) {
    iVar1 = uv__eventfd(0);
    if (iVar1 != -1) {
      uv__cloexec_ioctl(iVar1,1);
      uv__nonblock_ioctl(iVar1,1);
      return iVar1;
    }
    piVar2 = __errno_location();
    if (*piVar2 != 0x26) {
      piVar2 = __errno_location();
      return -*piVar2;
    }
    uv__async_eventfd::no_eventfd = 1;
  }
  return -0x26;
}

Assistant:

static int uv__async_eventfd(void) {
#if defined(__linux__)
  static int no_eventfd2;
  static int no_eventfd;
  int fd;

  if (no_eventfd2)
    goto skip_eventfd2;

  fd = uv__eventfd2(0, UV__EFD_CLOEXEC | UV__EFD_NONBLOCK);
  if (fd != -1)
    return fd;

  if (errno != ENOSYS)
    return UV__ERR(errno);

  no_eventfd2 = 1;

skip_eventfd2:

  if (no_eventfd)
    goto skip_eventfd;

  fd = uv__eventfd(0);
  if (fd != -1) {
    uv__cloexec(fd, 1);
    uv__nonblock(fd, 1);
    return fd;
  }

  if (errno != ENOSYS)
    return UV__ERR(errno);

  no_eventfd = 1;

skip_eventfd:

#endif

  return UV_ENOSYS;
}